

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWInstaller.cxx
# Opt level: O1

bool __thiscall cmCPackIFWResourcesParser::ParseResource(cmCPackIFWResourcesParser *this,size_t r)

{
  string local_38;
  
  this->hasFiles = false;
  this->hasErrors = false;
  cmsys::SystemTools::GetFilenamePath
            (&local_38,
             (this->installer->Resources).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + r);
  std::__cxx11::string::operator=((string *)&this->basePath,(string *)&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  (*(this->super_cmXMLParser)._vptr_cmXMLParser[3])
            (this,(this->installer->Resources).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[r]._M_dataplus._M_p);
  return (bool)((this->hasErrors ^ 1U) & this->hasFiles);
}

Assistant:

bool ParseResource(size_t r)
  {
    this->hasFiles = false;
    this->hasErrors = false;

    this->basePath =
      cmSystemTools::GetFilenamePath(this->installer->Resources[r]);

    this->ParseFile(this->installer->Resources[r].data());

    return this->hasFiles && !this->hasErrors;
  }